

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

int cmdline_parser_required2(gengetopt_args_info *args_info,char *prog_name,char *additional_error)

{
  int iVar1;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int error_occurred;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  uint max;
  FILE *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *local_68;
  char *local_50;
  char *local_38;
  int local_1c;
  
  max = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_1c = 0;
  if (*(int *)(in_RDI + 0x100) == 0) {
    local_38 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_38 = "";
    }
    fprintf(_stderr,"%s: \'--output\' (\'-o\') option required%s\n",in_RSI,local_38);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0x104) == 0) {
    local_50 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_50 = "";
    }
    fprintf(_stderr,"%s: \'--latticeConstant\' option required%s\n",in_RSI,local_50);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0x108) == 0) {
    local_68 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_68 = "";
    }
    fprintf(_stderr,"%s: \'--radius\' option required%s\n",in_RSI,local_68);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0x10c) == 0) {
    if (in_RDX == (char *)0x0) {
      in_RDX = "";
    }
    in_stack_ffffffffffffff88 = _stderr;
    fprintf(_stderr,"%s: \'--length\' option required%s\n",in_RSI,in_RDX);
    max = (uint)((ulong)in_RDX >> 0x20);
    local_1c = 1;
    in_stack_ffffffffffffff90 = in_RSI;
  }
  iVar1 = check_multiple_option_occurrences
                    (in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (uint)in_stack_ffffffffffffff88,max,in_stack_ffffffffffffff78);
  if (iVar1 != 0) {
    local_1c = 1;
  }
  iVar1 = check_multiple_option_occurrences
                    (in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (uint)in_stack_ffffffffffffff88,max,in_stack_ffffffffffffff78);
  if (iVar1 != 0) {
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

int
cmdline_parser_required2 (struct gengetopt_args_info *args_info, const char *prog_name, const char *additional_error)
{
  int error_occurred = 0;
  FIX_UNUSED (additional_error);

  /* checks for required options */
  if (! args_info->output_given)
    {
      fprintf (stderr, "%s: '--output' ('-o') option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->latticeConstant_given)
    {
      fprintf (stderr, "%s: '--latticeConstant' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->radius_given)
    {
      fprintf (stderr, "%s: '--radius' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->length_given)
    {
      fprintf (stderr, "%s: '--length' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (check_multiple_option_occurrences(prog_name, args_info->shellRadius_given, args_info->shellRadius_min, args_info->shellRadius_max, "'--shellRadius'"))
     error_occurred = 1;
  
  if (check_multiple_option_occurrences(prog_name, args_info->molFraction_given, args_info->molFraction_min, args_info->molFraction_max, "'--molFraction'"))
     error_occurred = 1;
  
  
  /* checks for dependences among options */

  return error_occurred;
}